

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::SyncRepeatedFieldWithMapNoLock
          (MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this)

{
  RepeatedPtrFieldBase *this_00;
  value_type *pvVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  long lVar3;
  long lVar4;
  Value *pVVar5;
  Arena *pAVar6;
  Value *from;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_60;
  undefined1 local_48 [8];
  const_iterator it;
  
  if ((this->
      super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ).super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    pAVar6 = (this->
             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
             ).super_MapFieldBase.arena_;
    if (pAVar6 == (Arena *)0x0) {
      pRVar2 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      (pRVar2->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if (pAVar6->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (pAVar6,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18);
      }
      pRVar2 = (RepeatedPtrField<google::protobuf::Message> *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&pAVar6->impl_,0x18,
                          arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                         );
      (pRVar2->super_RepeatedPtrFieldBase).arena_ = pAVar6;
      (pRVar2->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar2->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (this->
    super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ).super_MapFieldBase.repeated_field_ = pRVar2;
  }
  this_00 = &((this->
              super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
            (this_00);
  local_60.m_ = (this->impl_).map_.elements_;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  ::InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_60,(local_60.m_)->index_of_first_non_null_);
  it.it_.node_ = (Node *)local_60.m_;
  local_48 = (undefined1  [8])local_60.node_;
  while( true ) {
    if (local_48 == (undefined1  [8])0x0) {
      return;
    }
    lVar3 = (**(code **)(_Struct_FieldsEntry_DoNotUse_default_instance_ + 0x20))
                      (&_Struct_FieldsEntry_DoNotUse_default_instance_,
                       (this->
                       super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                       ).super_MapFieldBase.arena_);
    if ((lVar3 != 0) &&
       (lVar4 = __dynamic_cast(lVar3,&Message::typeinfo,&Struct_FieldsEntry_DoNotUse::typeinfo,0),
       lVar4 == 0)) break;
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
              (this_00,lVar3);
    *(uint *)(lVar3 + 0x20) = *(uint *)(lVar3 + 0x20) | 1;
    pAVar6 = *(Arena **)(lVar3 + 8);
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    if (((ArenaStringPtr *)(lVar3 + 0x10))->ptr_ == (string *)&fixed_address_empty_string_abi_cxx11_
       ) {
      ArenaStringPtr::CreateInstance
                ((ArenaStringPtr *)(lVar3 + 0x10),pAVar6,
                 (string *)&fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::_M_assign(*(string **)(lVar3 + 0x10));
    pvVar1 = ((KeyValuePair *)local_48)->v_;
    *(uint *)(lVar3 + 0x20) = *(uint *)(lVar3 + 0x20) | 2;
    pAVar6 = *(Arena **)(lVar3 + 8);
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    if (*(long *)(lVar3 + 0x18) == 0) {
      pVVar5 = Arena::CreateMaybeMessage<google::protobuf::Value>(pAVar6);
      *(Value **)(lVar3 + 0x18) = pVVar5;
    }
    from = &pvVar1->second;
    pVVar5 = *(Value **)(lVar3 + 0x18);
    if (from != pVVar5) {
      Value::Clear(pVVar5);
      Value::MergeFrom(pVVar5,from);
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
    ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                  *)local_48);
  }
  __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/casts.h"
                ,0x5e,
                "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::Struct_FieldsEntry_DoNotUse *, From = google::protobuf::Message]"
               );
}

Assistant:

void MapField<Derived, Key, T, kKeyFieldType, kValueFieldType,
              default_enum_value>::SyncRepeatedFieldWithMapNoLock() const {
  if (this->MapFieldBase::repeated_field_ == NULL) {
    if (this->MapFieldBase::arena_ == NULL) {
      this->MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      this->MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              this->MapFieldBase::arena_);
    }
  }
  const Map<Key, T>& map = impl_.GetMap();
  RepeatedPtrField<EntryType>* repeated_field =
      reinterpret_cast<RepeatedPtrField<EntryType>*>(
          this->MapFieldBase::repeated_field_);

  repeated_field->Clear();

  // The only way we can get at this point is through reflection and the
  // only way we can get the reflection object is by having called GetReflection
  // on the encompassing field. So that type must have existed and hence we
  // know that this MapEntry default_type has also already been constructed.
  // So it's safe to just call internal_default_instance().
  const Message* default_entry = Derived::internal_default_instance();
  for (typename Map<Key, T>::const_iterator it = map.begin(); it != map.end();
       ++it) {
    EntryType* new_entry =
        down_cast<EntryType*>(default_entry->New(this->MapFieldBase::arena_));
    repeated_field->AddAllocated(new_entry);
    (*new_entry->mutable_key()) = it->first;
    (*new_entry->mutable_value()) = it->second;
  }
}